

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_in_out_testing.cpp
# Opt level: O0

void execute_tests(void)

{
  byte bVar1;
  bool bVar2;
  FILE *__src;
  istream *piVar3;
  rep rVar4;
  ostream *poVar5;
  char *__rhs;
  long milli;
  duration<long,_std::ratio<1L,_1000000L>_> local_820;
  long local_818;
  long micro;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  string local_7b0;
  string local_790;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_770;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_750;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_710;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  string local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  allocator local_649;
  string local_648;
  allocator local_621;
  string local_620;
  allocator local_5f9;
  string local_5f8;
  string local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  undefined1 local_578 [8];
  string exp_line;
  string out_line;
  int local_530;
  int error_count;
  int line_nr;
  allocator local_501;
  string local_500;
  allocator local_4d9;
  string local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  byte local_435;
  bool skip_tests;
  istream local_428 [8];
  ifstream expected_file;
  istream local_220 [8];
  ifstream out_file;
  FILE *fp_out;
  
  stop.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  fclose(_stdout);
  __src = fdopen(old_stdout,"w");
  memcpy(_stdout,__src,0xd8);
  std::ifstream::ifstream(local_220,&out_name_abi_cxx11_);
  std::ifstream::ifstream(local_428,&expected_name_abi_cxx11_,8);
  local_435 = 0;
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::operator+(&local_478,"!! Problems reading from file \'",&out_name_abi_cxx11_);
    std::operator+(&local_458,&local_478,"\'\n");
    write_colored_text(&local_458,red);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_478);
    local_435 = 1;
  }
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::operator+(&local_4b8,"!! Problems reading from file \'",&expected_name_abi_cxx11_);
    std::operator+(&local_498,&local_4b8,"\'\n");
    write_colored_text(&local_498,red);
    std::__cxx11::string::~string((string *)&local_498);
    std::__cxx11::string::~string((string *)&local_4b8);
    local_435 = 1;
  }
  if ((local_435 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_500,"\nExecuting tests:",&local_501);
    write_colored_text(&local_500,blue);
    std::__cxx11::string::~string((string *)&local_500);
    std::allocator<char>::~allocator((allocator<char> *)&local_501);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&line_nr,"\n----------------\n",(allocator *)((long)&error_count + 3));
    write_colored_text((string *)&line_nr,blue);
    std::__cxx11::string::~string((string *)&line_nr);
    std::allocator<char>::~allocator((allocator<char> *)((long)&error_count + 3));
    local_530 = 0;
    out_line.field_2._12_4_ = 0;
    std::__cxx11::string::string((string *)(exp_line.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_578);
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (local_220,(string *)(exp_line.field_2._M_local_buf + 8));
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar2) break;
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (local_428,(string *)local_578);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (bVar2) {
        local_530 = local_530 + 1;
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&exp_line.field_2 + 8),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_578);
        if (bVar2) {
          std::__cxx11::to_string(&local_5d8,local_530);
          std::operator+(&local_5b8,"Error: Line ",&local_5d8);
          std::operator+(&local_598,&local_5b8,":\t");
          write_colored_text(&local_598,red);
          std::__cxx11::string::~string((string *)&local_598);
          std::__cxx11::string::~string((string *)&local_5b8);
          std::__cxx11::string::~string((string *)&local_5d8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_5f8,"Expected: ",&local_5f9);
          write_colored_text(&local_5f8,yellow);
          std::__cxx11::string::~string((string *)&local_5f8);
          std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
          poVar5 = std::operator<<((ostream *)&std::cout,(string *)local_578);
          std::operator<<(poVar5,"\t");
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_620,"Your output: ",&local_621);
          write_colored_text(&local_620,cyan);
          std::__cxx11::string::~string((string *)&local_620);
          std::allocator<char>::~allocator((allocator<char> *)&local_621);
          poVar5 = std::operator<<((ostream *)&std::cout,
                                   (string *)(exp_line.field_2._M_local_buf + 8));
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          out_line.field_2._12_4_ = out_line.field_2._12_4_ + 1;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_648,"You produced at least one line to much of output: ",
                   &local_649);
        write_colored_text(&local_648,red);
        std::__cxx11::string::~string((string *)&local_648);
        std::allocator<char>::~allocator((allocator<char> *)&local_649);
        poVar5 = std::operator<<((ostream *)&std::cout,(string *)(exp_line.field_2._M_local_buf + 8)
                                );
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        out_line.field_2._12_4_ = out_line.field_2._12_4_ + 1;
      }
    }
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (local_428,(string *)local_578);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar2) break;
      local_530 = local_530 + 1;
      std::__cxx11::to_string(&local_6b0,local_530);
      std::operator+(&local_690,"You failed to produce expected line ",&local_6b0);
      std::operator+(&local_670,&local_690,":  ");
      write_colored_text(&local_670,red);
      std::__cxx11::string::~string((string *)&local_670);
      std::__cxx11::string::~string((string *)&local_690);
      std::__cxx11::string::~string((string *)&local_6b0);
      poVar5 = std::operator<<((ostream *)&std::cout,(string *)local_578);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      out_line.field_2._12_4_ = out_line.field_2._12_4_ + 1;
    }
    if ((int)out_line.field_2._12_4_ < 1) {
      std::__cxx11::to_string((string *)&micro,local_530);
      std::operator+(&local_7f0,"Yes, no errors, all ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&micro);
      std::operator+(&local_7d0,&local_7f0," lines of output are correct!\n");
      write_colored_text(&local_7d0,green);
      std::__cxx11::string::~string((string *)&local_7d0);
      std::__cxx11::string::~string((string *)&local_7f0);
      std::__cxx11::string::~string((string *)&micro);
    }
    else {
      std::__cxx11::to_string(&local_790,out_line.field_2._12_4_);
      std::operator+(&local_770,"You produced ",&local_790);
      std::operator+(&local_750,&local_770," wrong line");
      __rhs = "s";
      if (out_line.field_2._12_4_ == 1) {
        __rhs = "";
      }
      std::operator+(&local_730,&local_750,__rhs);
      std::operator+(&local_710,&local_730," of totally ");
      std::__cxx11::to_string(&local_7b0,local_530);
      std::operator+(&local_6f0,&local_710,&local_7b0);
      std::operator+(&local_6d0,&local_6f0," lines of expected output!\n");
      write_colored_text(&local_6d0,magenta);
      std::__cxx11::string::~string((string *)&local_6d0);
      std::__cxx11::string::~string((string *)&local_6f0);
      std::__cxx11::string::~string((string *)&local_7b0);
      std::__cxx11::string::~string((string *)&local_710);
      std::__cxx11::string::~string((string *)&local_730);
      std::__cxx11::string::~string((string *)&local_750);
      std::__cxx11::string::~string((string *)&local_770);
      std::__cxx11::string::~string((string *)&local_790);
    }
    std::__cxx11::string::~string((string *)local_578);
    std::__cxx11::string::~string((string *)(exp_line.field_2._M_local_buf + 8));
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4d8,"-> Tests will be skipped !!\n",&local_4d9);
    write_colored_text(&local_4d8,red);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4d9);
  }
  std::ifstream::close();
  std::ifstream::close();
  milli = (long)std::chrono::operator-(&stop,&start);
  local_820.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)&milli);
  rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_820);
  local_818 = rVar4 % 1000;
  std::operator<<((ostream *)&std::cout,"Execution time for actual code: ");
  if (rVar4 / 1000 != 0) {
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,rVar4 / 1000);
    std::operator<<(poVar5,"\'");
  }
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_818);
  poVar5 = std::operator<<(poVar5," microseconds");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::ifstream::~ifstream(local_428);
  std::ifstream::~ifstream(local_220);
  return;
}

Assistant:

void execute_tests() {

    // Stop the timer:
    stop = chrono::high_resolution_clock::now();

    /*
     * Recreate the standard output to the terminal:
     * https://stackoverflow.com/questions/1908687/how-to-redirect-the-output-back-to-the-screen-after-freopenout-txt-a-stdo/1910044#1910044
     * Somehow, this only works once - the second time, the output didn't work anymore 
     *    (e.g., when I tried to call this file string_in_out_testing.cpp in a loop)
     */
    fclose(stdout);
    FILE *fp_out = fdopen(old_stdout, "w");    // Open old stdout as a stream
    // Reassign the terminal to stdin/stdout:
    *stdout = *fp_out;                          // NOLINT(misc-non-copyable-objects)

    /*
     * Recreate the standard input to the terminal.
     * DOESN'T YET WORK ?!   
     * (But this is not necessary for this project, except if I would want to run multiple times in a sequence)
     */
//    fclose(stdin);
//    FILE  *fp_in = fdopen(old_stdin, "r");  // Open old stdin as a stream
//    *stdin = *fp_in;                        // NOLINT(misc-non-copyable-objects)



    // Open 'out_name' and 'expected_name' for 'r'-access:
    // see https://www.tutorialspoint.com/cplusplus/cpp_files_streams.htm
    // ifstream ... : represents input file stream (for reading from files)
    // ofstream ... : represents output file stream (for creating and writing to files)
    // For comparing, you only need reading:
    ifstream out_file(out_name);
    ifstream expected_file(expected_name);

    bool skip_tests = false;
    if (!out_file.is_open()) {
        write_colored_text("!! Problems reading from file '" + out_name + "'\n");
        skip_tests = true;
    }
    if (!expected_file.is_open()) {
        write_colored_text("!! Problems reading from file '" + expected_name + "'\n");
        skip_tests = true;
    }

    // Run actual tests: do string-comparison line by line
    if (skip_tests) {
        write_colored_text("-> Tests will be skipped !!\n");
    } else {
        write_colored_text("\nExecuting tests:", blue);
        write_colored_text("\n----------------\n", blue);
//        cout << "\n----------------" << endl;
        int line_nr = 0, error_count = 0;
        string out_line, exp_line;

        while (getline(out_file, out_line)) {
            if (getline(expected_file, exp_line)) {
                line_nr++;
                /*
                 * NOTE: I wanted to compare the two string as described in
                 * various online resources, such as https://www.geeksforgeeks.org/stdstringcompare-in-c/
                 * With:
                 *      if (out_line.compare(exp_line) == 0)
                 * But CLion showed "Clang-Tidy: Do not use 'compare' to test equality of strings; use the string
                 *      equality operator instead"
                 *
                 * It seems the above construct would be great to see if a string is shorter or longer than the other:
                 *      int difference = out_line.compare(exp_line);
                 *
                 * But here, I only want to know if they are the same.
                 * -> after automatic refactoring
                 */
                if (out_line != exp_line) {
                    write_colored_text("Error: Line " + to_string(line_nr) + ":\t");
                    write_colored_text("Expected: ", yellow);
                    cout << exp_line << "\t";
                    write_colored_text("Your output: ", cyan);
                    cout << out_line << endl;
                    error_count++;
                }
            } else {
                write_colored_text("You produced at least one line to much of output: ");
                cout << out_line << endl;
                error_count++;
            }
        }

        // Check, if 'expected' has more lines than 'out':
        while (getline(expected_file, exp_line)) {
            line_nr++;
            write_colored_text("You failed to produce expected line " + to_string(line_nr) + ":  ");
            cout << exp_line << endl;
            error_count++;
        }

        if (error_count > 0) {
            write_colored_text(
                    "You produced " + to_string(error_count) + " wrong line" + (error_count == 1 ? "" : "s") +
                    " of totally " + to_string(line_nr) + " lines of expected output!\n",
                    magenta);
        } else {
            write_colored_text("Yes, no errors, all " + to_string(line_nr) + " lines of output are correct!\n",
                               green);
        }
    }

    out_file.close();
    expected_file.close();

    // Subtract stop and start time-points and cast it to required unit. 
    // Predefined units are: nanoseconds, microseconds, milliseconds, seconds, minutes, hours.
    // Use duration_cast() function: 
    long int micro = chrono::duration_cast<chrono::microseconds>(stop - start).count();
    long int milli = micro / 1000;
    micro %= 1000;
    cout << "Execution time for actual code: ";
    if (milli) cout << milli << "'";
    cout << micro << " microseconds" << endl;
}